

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void YUY2ToUV422Row_C(uint8_t *src_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  long lVar1;
  int iVar2;
  
  lVar1 = 0;
  for (iVar2 = 0; iVar2 < width; iVar2 = iVar2 + 2) {
    dst_u[lVar1] = src_yuy2[lVar1 * 4 + 1];
    dst_v[lVar1] = src_yuy2[lVar1 * 4 + 3];
    lVar1 = lVar1 + 1;
  }
  return;
}

Assistant:

void YUY2ToUV422Row_C(const uint8_t* src_yuy2,
                      uint8_t* dst_u,
                      uint8_t* dst_v,
                      int width) {
  // Output a row of UV values.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = src_yuy2[1];
    dst_v[0] = src_yuy2[3];
    src_yuy2 += 4;
    dst_u += 1;
    dst_v += 1;
  }
}